

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O3

string * __thiscall
pfederc::UnOpExpr::toString_abi_cxx11_(string *__return_storage_ptr__,UnOpExpr *this)

{
  Token *pTVar1;
  long lVar2;
  undefined8 *puVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  ulong *puVar7;
  ulong uVar8;
  long *local_c0;
  ulong local_b8;
  long local_b0;
  undefined8 uStack_a8;
  ulong *local_a0;
  long local_98;
  ulong local_90;
  undefined4 uStack_88;
  undefined4 uStack_84;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  long *local_60;
  ulong local_58;
  long local_50;
  long lStack_48;
  ulong *local_40 [2];
  ulong local_30 [2];
  
  pTVar1 = this->tokOp;
  if (pTVar1->type == TOK_OP_BRACKET_OPEN) {
    (*((this->expr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_a0);
    puVar3 = (undefined8 *)std::__cxx11::string::insert((ulong)&local_a0,0,'\x01');
    plVar4 = puVar3 + 2;
    if ((long *)*puVar3 == plVar4) {
      local_b0 = *plVar4;
      uStack_a8 = puVar3[3];
      local_c0 = &local_b0;
    }
    else {
      local_b0 = *plVar4;
      local_c0 = (long *)*puVar3;
    }
    local_b8 = puVar3[1];
    *puVar3 = plVar4;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_c0,local_b8,0,'\x01');
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      lVar2 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
    }
    local_30[0] = local_90;
    local_40[0] = local_a0;
    if (local_a0 == &local_90) {
      return __return_storage_ptr__;
    }
    goto LAB_0011ec71;
  }
  (*pTVar1->_vptr_Token[2])(local_40,pTVar1,(this->super_Expr).lexer);
  plVar4 = (long *)std::__cxx11::string::insert((ulong)local_40,0,'\x01');
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_50 = *plVar5;
    lStack_48 = plVar4[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar5;
    local_60 = (long *)*plVar4;
  }
  local_58 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_60,local_58,0,'\x01');
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_90 = *puVar7;
    uStack_88 = (undefined4)plVar4[3];
    uStack_84 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_a0 = &local_90;
  }
  else {
    local_90 = *puVar7;
    local_a0 = (ulong *)*plVar4;
  }
  local_98 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  (*((this->expr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
     _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
     super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_80);
  uVar8 = 0xf;
  if (local_a0 != &local_90) {
    uVar8 = local_90;
  }
  if (uVar8 < (ulong)(local_78 + local_98)) {
    uVar8 = 0xf;
    if (local_80 != local_70) {
      uVar8 = local_70[0];
    }
    if (uVar8 < (ulong)(local_78 + local_98)) goto LAB_0011eb3d;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_a0);
  }
  else {
LAB_0011eb3d:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80);
  }
  local_c0 = &local_b0;
  plVar4 = puVar3 + 2;
  if ((long *)*puVar3 == plVar4) {
    local_b0 = *plVar4;
    uStack_a8 = puVar3[3];
  }
  else {
    local_b0 = *plVar4;
    local_c0 = (long *)*puVar3;
  }
  local_b8 = puVar3[1];
  *puVar3 = plVar4;
  puVar3[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_c0,local_b8,0,'\x01');
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if (local_40[0] == local_30) {
    return __return_storage_ptr__;
  }
LAB_0011ec71:
  operator_delete(local_40[0],local_30[0] + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string UnOpExpr::toString() const noexcept {
  if (getOperatorType() == TokenType::TOK_OP_BRACKET_OPEN) {
    return '(' + getExpression().toString() + ')';
  }

  return '(' + getOperatorToken().toString(getLexer()) +
    ' ' + getExpression().toString() + ')';
}